

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_argv.c
# Opt level: O0

ssize_t mpt_message_argv(mpt_message *msg,int sep)

{
  ssize_t sVar1;
  ushort **ppuVar2;
  size_t local_48;
  size_t clen;
  ssize_t part;
  iovec curr;
  iovec *cont;
  int sep_local;
  mpt_message *msg_local;
  
  part = (ssize_t)msg->base;
  while (curr.iov_base = (void *)msg->used, curr.iov_base == (void *)0x0) {
    if (msg->clen == 0) {
      return -0x10;
    }
    part = (ssize_t)msg->cont->iov_base;
    msg->base = (void *)part;
    msg->used = msg->cont->iov_len;
    msg->cont = msg->cont + 1;
    msg->clen = msg->clen - 1;
  }
  curr.iov_len = (size_t)msg->cont;
  local_48 = msg->clen;
  if (sep == 0) {
    sVar1 = nextChar((iovec *)&part,(iovec *)curr.iov_len,local_48,0);
    return sVar1;
  }
  sVar1 = mpt_memfcn((iovec *)&part,1,notSpace,(void *)0x0);
  if (sVar1 < 0) {
    clen = mpt_memfcn((iovec *)curr.iov_len,local_48,notSpace,(void *)0x0);
    if (-1 < (long)clen) {
      for (; *(ulong *)(curr.iov_len + 8) < clen; curr.iov_len = curr.iov_len + 0x10) {
        clen = clen - *(long *)(curr.iov_len + 8);
        local_48 = local_48 - 1;
      }
      part = *(long *)curr.iov_len + clen;
      msg->base = (void *)part;
      curr.iov_base = (void *)(*(long *)(curr.iov_len + 8) - clen);
      msg->used = (size_t)curr.iov_base;
      msg->cont = (iovec *)curr.iov_len;
      msg->clen = local_48;
    }
  }
  else {
    part = part + sVar1;
    msg->base = (void *)part;
    curr.iov_base = (void *)((long)curr.iov_base - sVar1);
    msg->used = (size_t)curr.iov_base;
  }
  ppuVar2 = __ctype_b_loc();
  cont._4_4_ = sep;
  if (((*ppuVar2)[sep] & 0x8000) == 0) {
    sVar1 = mpt_memtok((iovec *)&part,1,"\t \n\r\v",(char *)0x0,"\'\"");
    if (-1 < sVar1) {
      return sVar1;
    }
    if ((local_48 != 0) &&
       (sVar1 = mpt_memtok((iovec *)curr.iov_len,local_48,"\t \n\r\v",(char *)0x0,"\'\""),
       -1 < sVar1)) {
      return (long)curr.iov_base + sVar1;
    }
    cont._4_4_ = 0;
  }
  sVar1 = nextChar((iovec *)&part,(iovec *)curr.iov_len,local_48,cont._4_4_);
  return sVar1;
}

Assistant:

extern ssize_t mpt_message_argv(MPT_STRUCT(message) *msg, int sep)
{
	struct iovec *cont;
	struct iovec curr;
	ssize_t part;
	size_t  clen;
	
	/* start on base data */
	curr.iov_base = (void *) msg->base;
	while (!(curr.iov_len = msg->used)) {
		if (!msg->clen) {
			return MPT_ERROR(MissingData);
		}
		curr.iov_base = (void *) (msg->base = msg->cont->iov_base);
		curr.iov_len = msg->used = msg->cont->iov_len;
		++msg->cont;
		--msg->clen;
	}
	cont = msg->cont;
	clen = msg->clen;
	
	/* find null character valid memory */
	if (!sep) {
		return nextChar(&curr, cont, clen, sep);
	}
	/* trim leading whitespace */
	if ((part = mpt_memfcn(&curr, 1, notSpace, 0)) >= 0) {
		msg->base = curr.iov_base = ((uint8_t *) curr.iov_base) + part;
		msg->used = curr.iov_len -= part;
	}
	else if ((part = mpt_memfcn(cont, clen, notSpace, 0)) >= 0) {
		while ((size_t) part > cont->iov_len) {
			part -= cont->iov_len;
			--clen;
			++cont;
		}
		msg->base = curr.iov_base = ((uint8_t *) cont->iov_base) + part;
		msg->used = curr.iov_len  = cont->iov_len - part;
		msg->cont = cont;
		msg->clen = clen;
	}
	/* find space character not in escapes */
	if (!isgraph(sep)) {
		if ((part = mpt_memtok(&curr, 1, "\t \n\r\v", NULL, "'\"")) >= 0) {
			return part;
		}
		if (clen && (part = mpt_memtok(cont, clen, "\t \n\r\v", NULL, "'\"")) >= 0) {
			return curr.iov_len + part;
		}
		sep = 0;
	}
	/* check for termination */
	return nextChar(&curr, cont, clen, sep);
}